

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O3

bool slang::syntax::SyntaxFacts::isPossiblePattern(TokenKind kind)

{
  bool bVar1;
  int iVar2;
  undefined6 in_register_0000003a;
  
  bVar1 = true;
  iVar2 = (int)CONCAT62(in_register_0000003a,kind);
  if ((iVar2 != 0xc) && (iVar2 != 0x19)) {
    if (iVar2 != 0x5b) {
      bVar1 = isPossibleExpression(kind);
      return bVar1;
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool SyntaxFacts::isPossiblePattern(TokenKind kind) {
    switch (kind) {
        case TokenKind::Dot:
        case TokenKind::ApostropheOpenBrace:
            return true;
        case TokenKind::TripleAnd:
            return false;
        default:
            return isPossibleExpression(kind);
    }
}